

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O2

void testAttrPreview(string *tempdir)

{
  int iVar1;
  exr_result_t eVar2;
  exr_context_t ctxt;
  long lVar3;
  char *pcVar4;
  ostream *poVar5;
  char *pcVar6;
  char *in_RCX;
  _internal_exr_context *pctxt;
  uint8_t local_3c [4];
  exr_attr_preview_t p;
  exr_context_t f;
  
  ctxt = createDummyFile("<preview>");
  local_3c[0] = 0xde;
  local_3c[1] = 0xad;
  local_3c[2] = 0xbe;
  local_3c[3] = 0xef;
  f = ctxt;
  if (ctxt == (exr_context_t)0x0) {
    iVar1 = 2;
  }
  else {
    iVar1 = (**(code **)(ctxt + 0x40))(ctxt,3,"Invalid reference to preview object to initialize");
    if (iVar1 == 3) {
      pcVar4 = (char *)0xffffffffffffffff;
      iVar1 = (**(code **)(ctxt + 0x48))
                        (ctxt,3,"Invalid very large size for preview image (%u x %u - %lu bytes)",
                         0xffffffffffffffff,0x40,0xffffffff00);
      if (iVar1 != 3) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar6 = (char *)exr_get_default_error_message(iVar1);
        poVar5 = std::operator<<(poVar5,pcVar6);
        poVar5 = std::operator<<(poVar5,"\n    expected: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar6 = (char *)exr_get_default_error_message(3);
        poVar5 = std::operator<<(poVar5,pcVar6);
        std::endl<char,std::char_traits<char>>(poVar5);
        core_test_fail("exr_attr_preview_init (f, &p, (uint32_t) -1, 64)",(char *)0x325,0x1532a0,
                       pcVar4);
      }
      pcVar4 = (char *)0x40;
      iVar1 = (**(code **)(ctxt + 0x48))
                        (ctxt,3,"Invalid very large size for preview image (%u x %u - %lu bytes)",
                         0x40,0xffffffffffffffff,0xffffffff00);
      if (iVar1 != 3) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar6 = (char *)exr_get_default_error_message(iVar1);
        poVar5 = std::operator<<(poVar5,pcVar6);
        poVar5 = std::operator<<(poVar5,"\n    expected: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar6 = (char *)exr_get_default_error_message(3);
        poVar5 = std::operator<<(poVar5,pcVar6);
        std::endl<char,std::char_traits<char>>(poVar5);
        core_test_fail("exr_attr_preview_init (f, &p, 64, (uint32_t) -1)",(char *)0x328,0x1532a0,
                       pcVar4);
      }
      lVar3 = (**(code **)(ctxt + 0x58))(4);
      if (lVar3 == 0) {
        iVar1 = (**(code **)(ctxt + 0x38))(ctxt,1);
        if (iVar1 != 0) {
          poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1);
          poVar5 = std::operator<<(poVar5,") ");
          pcVar6 = (char *)exr_get_default_error_message(iVar1);
          poVar5 = std::operator<<(poVar5,pcVar6);
          std::endl<char,std::char_traits<char>>(poVar5);
          core_test_fail("exr_attr_preview_init (f, &p, 1, 1)",(char *)0x329,0x1532a0,pcVar4);
        }
        core_test_fail("p.width == 1",(char *)0x32a,0x1532a0,pcVar4);
      }
      (**(code **)(ctxt + 0x60))(lVar3);
      s_malloc_fail_on = 1;
      p.width = 0;
      p.height = 0;
      p.alloc_size = 0;
      p.rgba = (uint8_t *)(**(code **)(ctxt + 0x58))(4);
      if (p.rgba == (uint8_t *)0x0) {
        iVar1 = (**(code **)(ctxt + 0x38))(ctxt,1);
        s_malloc_fail_on = 0;
        if (iVar1 == 1) {
          pcVar4 = (char *)0x1;
          eVar2 = exr_attr_preview_create(ctxt,&p,1,1,local_3c);
          if (eVar2 != 0) {
            poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,eVar2);
            poVar5 = std::operator<<(poVar5,") ");
            pcVar6 = (char *)exr_get_default_error_message(eVar2);
            poVar5 = std::operator<<(poVar5,pcVar6);
            std::endl<char,std::char_traits<char>>(poVar5);
            core_test_fail("exr_attr_preview_create (f, &p, 1, 1, data1x1)",(char *)0x336,0x1532a0,
                           pcVar4);
          }
          if (p.width != 1) {
            core_test_fail("p.width == 1",(char *)0x337,0x1532a0,pcVar4);
          }
          if (p.height != 1) {
            core_test_fail("p.height == 1",(char *)0x338,0x1532a0,pcVar4);
          }
          if (p.alloc_size != 4) {
            core_test_fail("p.alloc_size == 4",(char *)0x339,0x1532a0,pcVar4);
          }
          if (p.rgba == (uint8_t *)0x0) {
            core_test_fail("p.rgba != __null",(char *)0x33a,0x1532a0,pcVar4);
          }
          if (*p.rgba != 0xde) {
            core_test_fail("p.rgba[0] == 0xDE",(char *)0x33b,0x1532a0,pcVar4);
          }
          if (p.rgba[1] != 0xad) {
            core_test_fail("p.rgba[1] == 0xAD",(char *)0x33c,0x1532a0,pcVar4);
          }
          if (p.rgba[2] != 0xbe) {
            core_test_fail("p.rgba[2] == 0xBE",(char *)0x33d,0x1532a0,pcVar4);
          }
          if (p.rgba[3] != 0xef) {
            core_test_fail("p.rgba[3] == 0xEF",(char *)0x33e,0x1532a0,pcVar4);
          }
          (**(code **)(ctxt + 0x60))();
          p.width = 0;
          p.height = 0;
          p.alloc_size = 0;
          p.rgba = (uint8_t *)0x0;
          s_malloc_fail_on = 1;
          pcVar4 = (char *)0x1;
          eVar2 = exr_attr_preview_create(ctxt,&p,1,1,local_3c);
          s_malloc_fail_on = 0;
          if (eVar2 != 1) {
            poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,eVar2);
            poVar5 = std::operator<<(poVar5,") ");
            pcVar6 = (char *)exr_get_default_error_message(eVar2);
            poVar5 = std::operator<<(poVar5,pcVar6);
            poVar5 = std::operator<<(poVar5,"\n    expected: (");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,1);
            poVar5 = std::operator<<(poVar5,") ");
            pcVar6 = (char *)exr_get_default_error_message(1);
            poVar5 = std::operator<<(poVar5,pcVar6);
            std::endl<char,std::char_traits<char>>(poVar5);
            core_test_fail("exr_attr_preview_create (f, &p, 1, 1, data1x1)",(char *)0x344,0x1532a0,
                           pcVar4);
          }
          exr_finish(&f);
          return;
        }
      }
      else {
        iVar1 = 0;
      }
      s_malloc_fail_on = 0;
      poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1);
      poVar5 = std::operator<<(poVar5,") ");
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      poVar5 = std::operator<<(poVar5,pcVar6);
      poVar5 = std::operator<<(poVar5,"\n    expected: (");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,1);
      poVar5 = std::operator<<(poVar5,") ");
      pcVar6 = (char *)exr_get_default_error_message(1);
      poVar5 = std::operator<<(poVar5,pcVar6);
      std::endl<char,std::char_traits<char>>(poVar5);
      core_test_fail("exr_attr_preview_init (f, &p, 1, 1)",(char *)0x334,0x1532a0,pcVar4);
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1);
  poVar5 = std::operator<<(poVar5,") ");
  pcVar4 = (char *)exr_get_default_error_message(iVar1);
  poVar5 = std::operator<<(poVar5,pcVar4);
  poVar5 = std::operator<<(poVar5,"\n    expected: (");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
  poVar5 = std::operator<<(poVar5,") ");
  pcVar4 = (char *)exr_get_default_error_message(3);
  poVar5 = std::operator<<(poVar5,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar5);
  core_test_fail("exr_attr_preview_init (f, __null, 64, 64)",(char *)0x31f,0x1532a0,in_RCX);
}

Assistant:

void
testAttrPreview (const std::string& tempdir)
{
    // we no longer allow a null context as we need the memory allocator
    //testPreviewHelper (NULL);
    exr_context_t f = createDummyFile ("<preview>");
    testPreviewHelper (f);
    exr_finish (&f);
}